

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t __n;
  char *__s1;
  int iVar1;
  float fVar2;
  dictionary *ini;
  void *__s;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  MppBuffer buffer;
  IepTestCfg cfg;
  pthread_t td;
  IepTestInfo info;
  long local_250;
  int local_248;
  int local_244;
  uint local_240;
  int local_23c;
  int local_238;
  uint local_234;
  char local_230 [100];
  char local_1cc [100];
  char local_168 [104];
  FILE *local_100;
  FILE *local_f8;
  int local_f0;
  dictionary *local_e8;
  int *local_e0;
  float *local_d8;
  float *local_d0;
  int *local_c8;
  pthread_t local_c0;
  int *local_b8;
  long local_b0;
  long local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  void *local_90;
  long local_88;
  void *local_80;
  long local_78;
  long local_38;
  
  if (argc < 2) {
    iep_test_help();
LAB_00103981:
    iVar1 = 0;
  }
  else {
    memset(&local_248,0,0x188);
    memset(&local_b8,0,0x88);
    local_240 = 0x12;
    local_234 = 0x12;
    _opterr = 0;
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while (iVar1 = getopt(argc,argv,"f:w:h:c:F:W:H:C:m:x:"), __s1 = _optarg, 0x65 < iVar1) {
              if (iVar1 < 0x6d) {
                if (iVar1 == 0x66) {
                  _mpp_log_l(4,"iep_test","input filename: %s\n",0,_optarg);
                  strncpy(local_230,_optarg,99);
                  local_100 = fopen(local_230,"rb");
                }
                else if (iVar1 == 0x68) {
                  local_244 = atoi(_optarg);
                }
              }
              else if (iVar1 == 0x6d) {
                iVar1 = strcmp(_optarg,"deinterlace");
                if (iVar1 == 0) {
                  local_f0 = 1;
                }
                else {
                  iVar1 = strcmp(__s1,"yuvenhance");
                  if (iVar1 == 0) {
                    local_f0 = 2;
                  }
                  else {
                    iVar1 = strcmp(__s1,"rgbenhance");
                    if (iVar1 == 0) {
                      local_f0 = 3;
                    }
                    else {
                      _mpp_log_l(2,"iep_test","invalid work mode %s\n",0,__s1);
                      local_f0 = 0;
                    }
                  }
                }
              }
              else if (iVar1 == 0x78) {
                _mpp_log_l(4,"iep_test","configure filename: %s\n",0,_optarg);
                strncpy(local_168,_optarg,99);
                ini = iniparser_load(local_168);
                local_e8 = ini;
                if (ini == (dictionary *)0x0) {
                  _mpp_log_l(2,"iep_test","invalid configure file %s\n",0,_optarg);
                }
                else {
                  local_e0 = (int *)mpp_osal_calloc("parse_cfg",0x20);
                  iVar1 = iniparser_find_entry(ini,"deinterlace");
                  if (iVar1 == 0) {
                    local_e0[2] = 1;
                    local_e0[0] = 2;
                    local_e0[1] = 1;
                    local_e0[4] = 0;
                    local_e0[5] = 0;
                    local_e0[6] = 0;
                    local_e0[7] = 0;
                  }
                  else {
                    if ((local_e0 == (int *)0x0) &&
                       (_mpp_log_l(2,"iep_test","Assertion %s failed at %s:%d\n",0,"cfg->dei_cfg",
                                   "parse_cfg",0x5f), (DAT_001121a3 & 0x10) != 0))
                    goto LAB_00104619;
                    iVar1 = iniparser_getint(ini,"deinterlace:high_freq_en",0);
                    local_e0[2] = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_mode",0);
                    *local_e0 = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_high_freq_fct",0);
                    local_e0[3] = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_ei_mode",0);
                    local_e0[4] = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_ei_smooth",0);
                    local_e0[5] = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_ei_sel",0);
                    local_e0[6] = iVar1;
                    iVar1 = iniparser_getint(ini,"deinterlace:dei_ei_radius",0);
                    local_e0[7] = iVar1;
                  }
                  iVar1 = iniparser_find_entry(ini,"yuv enhance");
                  if (iVar1 != 0) {
                    local_d8 = (float *)mpp_osal_calloc("parse_cfg",0x18);
                    iVar1 = iniparser_getint(ini,"yuv enhance:saturation",0);
                    *local_d8 = (float)iVar1;
                    iVar1 = iniparser_getint(ini,"yuv enhance:contrast",0);
                    local_d8[1] = (float)iVar1;
                    iVar1 = iniparser_getint(ini,"yuv enhance:brightness",0);
                    *(char *)(local_d8 + 2) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"yuv enhance:hue_angle",0);
                    local_d8[3] = (float)iVar1;
                    fVar2 = (float)iniparser_getint(ini,"yuv enhance:video_mode",0);
                    local_d8[4] = fVar2;
                    iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_y",0);
                    *(char *)(local_d8 + 5) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_u",0);
                    *(char *)((long)local_d8 + 0x15) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_v",0);
                    *(char *)((long)local_d8 + 0x16) = (char)iVar1;
                  }
                  iVar1 = iniparser_find_entry(ini,"rgb enhance");
                  if (iVar1 != 0) {
                    local_d0 = (float *)mpp_osal_calloc("parse_cfg",0x40);
                    iVar1 = iniparser_getint(ini,"rgb enhance:coe",0);
                    *local_d0 = (float)iVar1;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:mode",0);
                    local_d0[1] = fVar2;
                    iVar1 = iniparser_getint(ini,"rgb enhance:cg_en",0);
                    *(char *)(local_d0 + 2) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"rgb enhance:cg_rr",0);
                    *(double *)(local_d0 + 4) = (double)iVar1;
                    iVar1 = iniparser_getint(ini,"rgb enhance:cg_rg",0);
                    *(double *)(local_d0 + 6) = (double)iVar1;
                    iVar1 = iniparser_getint(ini,"rgb enhance:cg_rb",0);
                    *(double *)(local_d0 + 8) = (double)iVar1;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:order",0);
                    local_d0[10] = fVar2;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:threshold",0);
                    local_d0[0xb] = fVar2;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:alpha_num",0);
                    local_d0[0xc] = fVar2;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:alpha_base",0);
                    local_d0[0xd] = fVar2;
                    fVar2 = (float)iniparser_getint(ini,"rgb enhance:radius",0);
                    local_d0[0xe] = fVar2;
                  }
                  iVar1 = iniparser_find_entry(ini,"colorcvt");
                  if (iVar1 != 0) {
                    local_c8 = (int *)mpp_osal_calloc("parse_cfg",0x10);
                    iVar1 = iniparser_getint(ini,"colorcvt:rgb2yuv_mode",0);
                    *local_c8 = iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:yuv2rgb_mode",0);
                    local_c8[1] = iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:rgb2yuv_input_clip",0);
                    *(char *)(local_c8 + 2) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:yuv2rgb_input_clip",0);
                    *(char *)((long)local_c8 + 9) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:global_alpha_value",0);
                    *(char *)((long)local_c8 + 10) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:dither_up_en",0);
                    *(char *)((long)local_c8 + 0xb) = (char)iVar1;
                    iVar1 = iniparser_getint(ini,"colorcvt:dither_down_en",0);
                    *(char *)(local_c8 + 3) = (char)iVar1;
                  }
                }
              }
              else if (iVar1 == 0x77) {
                local_248 = atoi(_optarg);
              }
            }
            if (iVar1 < 0x48) break;
            if (iVar1 == 0x48) {
              local_238 = atoi(_optarg);
            }
            else if (iVar1 == 0x57) {
              local_23c = atoi(_optarg);
            }
            else if (iVar1 == 99) {
              local_240 = str_to_iep_fmt(_optarg);
            }
          }
          if (iVar1 != 0x43) break;
          local_234 = str_to_iep_fmt(_optarg);
        }
        if (iVar1 != 0x46) break;
        _mpp_log_l(4,"iep_test","output filename: %s\n",0,_optarg);
        strncpy(local_1cc,_optarg,99);
        local_f8 = fopen(local_1cc,"w+b");
      }
    } while (iVar1 != -1);
    iVar1 = 0;
    if (local_248 < 1) {
      _mpp_log_l(2,"iep_test","non-positive input width %d\n",0);
      iVar1 = -1;
    }
    if (local_244 < 1) {
      _mpp_log_l(2,"iep_test","non-positive input height %d\n",0);
      iVar1 = -1;
    }
    if (0x17 < local_240) {
      _mpp_log_l(2,"iep_test","invalid input format\n",0);
      iVar1 = -1;
    }
    if (local_100 == (FILE *)0x0) {
      _mpp_log_l(2,"iep_test","failed to open input file %s\n",0,local_230);
      iVar1 = -1;
    }
    if (local_23c < 1) {
      _mpp_log_l(2,"iep_test","non-positive input width %d\n",0);
      iVar1 = -1;
    }
    if (local_238 < 1) {
      _mpp_log_l(2,"iep_test","non-positive input height %d\n",0);
      iVar1 = -1;
    }
    if (local_234 < 0x18) {
      if (local_f0 != 0) {
        if (iVar1 != 0) goto LAB_0010433d;
        local_b8 = &local_248;
        iVar1 = 0;
        if (local_240 < 0x18) {
          if ((0x330030U >> (local_240 & 0x1f) & 1) == 0) {
            if ((0xfU >> (local_240 & 0x1f) & 1) == 0) {
              iVar1 = 0;
              if ((0xcc0000U >> (local_240 & 0x1f) & 1) != 0) {
                iVar1 = (local_244 * local_248 * 3) / 2;
              }
            }
            else {
              iVar1 = local_244 * local_248 * 4;
            }
          }
          else {
            iVar1 = local_244 * local_248 * 2;
          }
        }
        local_b0 = (long)iVar1;
        iVar1 = 0;
        if (local_234 < 0x18) {
          if ((0x330030U >> (local_234 & 0x1f) & 1) == 0) {
            if ((0xfU >> (local_234 & 0x1f) & 1) == 0) {
              iVar1 = 0;
              if ((0xcc0000U >> (local_234 & 0x1f) & 1) != 0) {
                iVar1 = (local_238 * local_23c * 3) / 2;
              }
            }
            else {
              iVar1 = local_238 * local_23c * 4;
            }
          }
          else {
            iVar1 = local_238 * local_23c * 2;
          }
        }
        local_a8 = (long)iVar1;
        local_250 = 0;
        uVar5 = local_b0 + 0xfff;
        uVar6 = uVar5 & 0xfffffffffffff000;
        uVar3 = local_a8 + 0xfffU & 0xfffffffffffff000;
        __n = (uVar3 + uVar6) * 2;
        mpp_buffer_get_with_tag(0,&local_250,__n,"iep_test","main");
        if ((local_250 == 0) &&
           (_mpp_log_l(2,"iep_test","Assertion %s failed at %s:%d\n",0,"buffer","main",0x212),
           (DAT_001121a3 & 0x10) != 0)) {
LAB_00104619:
          abort();
        }
        iVar1 = mpp_buffer_get_fd_with_caller(local_250,"main");
        __s = (void *)mpp_buffer_get_ptr_with_caller(local_250,"main");
        memset(__s,0xff,__n);
        local_9c = ((uint)uVar5 & 0xfffff000) * 0x400 + iVar1;
        iVar4 = (int)(uVar6 * 2);
        local_98 = iVar4 * 0x400 + iVar1;
        local_94 = ((int)uVar3 + iVar4) * 0x400 + iVar1;
        local_88 = uVar6 + (long)__s;
        local_80 = (void *)((long)__s + uVar6 * 2);
        local_78 = (long)local_80 + uVar3;
        local_a0 = iVar1;
        local_90 = __s;
        iep_init(&local_38);
        pthread_create(&local_c0,(pthread_attr_t *)0x0,iep_process_thread,&local_b8);
        pthread_join(local_c0,(void **)0x0);
        if (local_38 != 0) {
          iep_deinit();
          local_38 = 0;
        }
        if (local_100 != (FILE *)0x0) {
          fclose(local_100);
          local_100 = (FILE *)0x0;
        }
        if (local_f8 != (FILE *)0x0) {
          fclose(local_f8);
          local_f8 = (FILE *)0x0;
        }
        if (local_e8 != (dictionary *)0x0) {
          iniparser_freedict(local_e8);
          local_e8 = (dictionary *)0x0;
          if (local_d8 != (float *)0x0) {
            mpp_osal_free("main");
          }
          if (local_d0 != (float *)0x0) {
            mpp_osal_free("main");
          }
          if (local_e0 != (int *)0x0) {
            mpp_osal_free("main");
          }
          if (local_c8 != (int *)0x0) {
            mpp_osal_free("main");
          }
        }
        mpp_buffer_put_with_caller(local_250,"main");
        goto LAB_00103981;
      }
LAB_00104321:
      _mpp_log_l(2,"iep_test","invalid work mode\n",0);
    }
    else {
      _mpp_log_l(2,"iep_test","invalid input format\n",0);
      if (local_f0 == 0) goto LAB_00104321;
    }
LAB_0010433d:
    _mpp_log_l(2,"iep_test","failed to pass cmd line check\n",0);
    iep_test_help();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    IepTestCfg cfg;
    IepTestInfo info;
    int ch;

    if (argc < 2) {
        iep_test_help();
        return 0;
    }

    memset(&cfg, 0, sizeof(cfg));
    memset(&info, 0, sizeof(info));
    cfg.src_fmt = IEP_FORMAT_YCbCr_420_SP;
    cfg.dst_fmt = IEP_FORMAT_YCbCr_420_SP;

    /// get options
    opterr = 0;
    while ((ch = getopt(argc, argv, "f:w:h:c:F:W:H:C:m:x:")) != -1) {
        switch (ch) {
        case 'w': {
            cfg.src_w = atoi(optarg);
        } break;
        case 'h': {
            cfg.src_h = atoi(optarg);
        } break;
        case 'c': {
            cfg.src_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'W': {
            cfg.dst_w = atoi(optarg);
        } break;
        case 'H': {
            cfg.dst_h = atoi(optarg);
        } break;
        case 'C': {
            cfg.dst_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'f': {
            mpp_log("input filename: %s\n", optarg);
            strncpy(cfg.src_url, optarg, sizeof(cfg.src_url) - 1);
            cfg.fp_src = fopen(cfg.src_url, "rb");
        } break;
        case 'F': {
            mpp_log("output filename: %s\n", optarg);
            strncpy(cfg.dst_url, optarg, sizeof(cfg.dst_url) - 1);
            cfg.fp_dst = fopen(cfg.dst_url, "w+b");
        } break;
        case 'm': {
            if (!strcmp(optarg, "deinterlace")) {
                cfg.mode = TEST_CASE_DEINTERLACE;
            } else if (!strcmp(optarg, "yuvenhance")) {
                cfg.mode = TEST_CASE_YUVENHANCE;
            } else if (!strcmp(optarg, "rgbenhance")) {
                cfg.mode = TEST_CASE_RGBENHANCE;
            } else {
                mpp_err("invalid work mode %s\n", optarg);
                cfg.mode = TEST_CASE_NONE;
            }
        } break;
        case 'x': {
            mpp_log("configure filename: %s\n", optarg);
            strncpy(cfg.cfg_url, optarg, sizeof(cfg.cfg_url) - 1);
            cfg.ini = iniparser_load(cfg.cfg_url);
            if (cfg.ini)
                parse_cfg(&cfg);
            else
                mpp_err("invalid configure file %s\n", optarg);
        } break;
        default: {
        } break;
        }
    }

    if (check_input_cmd(&cfg)) {
        mpp_err("failed to pass cmd line check\n");
        iep_test_help();
        return -1;
    }

    info.cfg = &cfg;
    info.src_size = get_image_size(cfg.src_w, cfg.src_h, cfg.src_fmt);
    info.dst_size = get_image_size(cfg.dst_w, cfg.dst_h, cfg.dst_fmt);

    // allocate 12M in/out memory and initialize memory address
    MppBuffer buffer = NULL;
    size_t src_size = MPP_ALIGN(info.src_size, SZ_4K);
    size_t dst_size = MPP_ALIGN(info.dst_size, SZ_4K);
    // NOTE: deinterlace need 4 fields (2 frames) as input and output 2 frames
    size_t total_size = src_size * 2 + dst_size * 2;

    mpp_buffer_get(NULL, &buffer, total_size);
    mpp_assert(buffer);

    int buf_fd = mpp_buffer_get_fd(buffer);
    RK_U8 *buf_ptr = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    memset(buf_ptr, 0xff, total_size);

    info.phy_src0 = ADD_OFFSET(buf_fd, 0);
    info.phy_src1 = ADD_OFFSET(buf_fd, src_size);
    info.phy_dst0 = ADD_OFFSET(buf_fd, src_size * 2);
    info.phy_dst1 = ADD_OFFSET(buf_fd, src_size * 2 + dst_size);

    info.vir_src0 = buf_ptr;
    info.vir_src1 = buf_ptr + src_size;
    info.vir_dst0 = buf_ptr + src_size * 2;
    info.vir_dst1 = buf_ptr + src_size * 2 + dst_size;

    iep_init(&info.ctx);

    pthread_t td;
    pthread_create(&td, NULL, iep_process_thread, &info);
    pthread_join(td, NULL);

    if (info.ctx) {
        iep_deinit(info.ctx);
        info.ctx = NULL;
    }

    if (cfg.fp_src) {
        fclose(cfg.fp_src);
        cfg.fp_src = NULL;
    }

    if (cfg.fp_dst) {
        fclose(cfg.fp_dst);
        cfg.fp_dst = NULL;
    }

    if (cfg.ini) {
        iniparser_freedict(cfg.ini);
        cfg.ini = NULL;
        if (cfg.yuv_enh)
            mpp_free(cfg.yuv_enh);
        if (cfg.rgb_enh)
            mpp_free(cfg.rgb_enh);
        if (cfg.dei_cfg)
            mpp_free(cfg.dei_cfg);
        if (cfg.colorcvt)
            mpp_free(cfg.colorcvt);
    }

    mpp_buffer_put(buffer);

    return 0;
}